

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_ext.cpp
# Opt level: O0

var cs_impl::runtime_cs_ext::await(var *func)

{
  initializer_list<cs_impl::any> __l;
  bool bVar1;
  async_callable *in_RDI;
  undefined1 *puVar2;
  object_method *om;
  any *in_stack_fffffffffffffea8;
  async_callable *in_stack_fffffffffffffeb0;
  type_info *in_stack_fffffffffffffeb8;
  type_info *in_stack_fffffffffffffec0;
  vector *in_stack_fffffffffffffed0;
  allocator_type *in_stack_fffffffffffffed8;
  async_callable *in_stack_fffffffffffffee0;
  undefined1 *puVar3;
  iterator in_stack_fffffffffffffee8;
  async_callable *func_00;
  undefined1 local_e1;
  undefined1 *local_e0;
  undefined1 local_d8 [8];
  any *in_stack_ffffffffffffff30;
  
  func_00 = in_RDI;
  any::type((any *)in_stack_fffffffffffffeb0);
  bVar1 = std::type_info::operator==(in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
  if (bVar1) {
    async_callable::async_callable(in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
    fiber::await<cs_impl::runtime_cs_ext::async_callable>(func_00);
    async_callable::~async_callable(in_stack_fffffffffffffeb0);
  }
  else {
    any::type((any *)in_stack_fffffffffffffeb0);
    bVar1 = std::type_info::operator==(in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
    if (bVar1) {
      any::const_val<cs::object_method>(in_stack_ffffffffffffff30);
      local_e0 = local_d8;
      any::any((any *)in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
      puVar3 = &local_e1;
      std::allocator<cs_impl::any>::allocator((allocator<cs_impl::any> *)0x25ac4b);
      __l._M_len = (size_type)puVar3;
      __l._M_array = in_stack_fffffffffffffee8;
      std::vector<cs_impl::any,_std::allocator<cs_impl::any>_>::vector
                ((vector<cs_impl::any,_std::allocator<cs_impl::any>_> *)in_stack_fffffffffffffee0,
                 __l,in_stack_fffffffffffffed8);
      async_callable::async_callable
                (in_stack_fffffffffffffee0,(var *)in_stack_fffffffffffffed8,
                 in_stack_fffffffffffffed0);
      fiber::await<cs_impl::runtime_cs_ext::async_callable>(func_00);
      async_callable::~async_callable(in_stack_fffffffffffffeb0);
      std::vector<cs_impl::any,_std::allocator<cs_impl::any>_>::~vector
                ((vector<cs_impl::any,_std::allocator<cs_impl::any>_> *)in_stack_fffffffffffffec0);
      std::allocator<cs_impl::any>::~allocator((allocator<cs_impl::any> *)0x25acc3);
      puVar3 = local_d8;
      puVar2 = &stack0xffffffffffffff30;
      do {
        puVar2 = puVar2 + -8;
        any::~any((any *)0x25acec);
      } while (puVar2 != puVar3);
    }
    else {
      any::any<cs::pointer>((any *)in_stack_fffffffffffffec0,(pointer *)in_stack_fffffffffffffeb8);
    }
  }
  return (var)(proxy *)in_RDI;
}

Assistant:

var await(const var &func)
		{
			if (func.type() == typeid(callable)) {
				return fiber::await(async_callable(func));
			}
			else if (func.type() == typeid(object_method)) {
				const auto &om = func.const_val<object_method>();
				return fiber::await(async_callable(om.callable, {om.object}));
			}
			return null_pointer;
		}